

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O0

int64_t uncompress(File *fout,int64_t inSize,File *fin)

{
  type puVar1;
  size_type sVar2;
  size_t sVar3;
  ulong uVar4;
  reference target;
  funzip_exception *this;
  int iStack_100b8;
  int rc;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uStack_100a8;
  __array data;
  mz_stream stream;
  array<unsigned_char,_65536UL> buf;
  int64_t total;
  File *fin_local;
  int64_t inSize_local;
  File *fout_local;
  
  buf._M_elems[0xfff8] = '\0';
  buf._M_elems[0xfff9] = '\0';
  buf._M_elems[0xfffa] = '\0';
  buf._M_elems[0xfffb] = '\0';
  buf._M_elems[0xfffc] = '\0';
  buf._M_elems[0xfffd] = '\0';
  buf._M_elems[0xfffe] = '\0';
  buf._M_elems[0xffff] = '\0';
  memset(&data,0,0x70);
  mz_inflateInit2((mz_streamp)&data,-0xf);
  if (inSize < 1) {
    std::array<unsigned_char,_65536UL>::size((array<unsigned_char,_65536UL> *)&stream.reserved);
  }
  std::make_unique<unsigned_char[]>((size_t)&uStack_100a8);
  if (0 < inSize) {
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       (&uStack_100a8,0);
    File::Read<unsigned_char>(fin,puVar1,inSize);
    data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                   (&uStack_100a8,0);
    stream.next_in._0_4_ = (int)inSize;
  }
  iStack_100b8 = 0;
  while (iStack_100b8 == 0) {
    if ((inSize == 0) && ((int)stream.next_in == 0)) {
      data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                     (&uStack_100a8,0);
      puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&uStack_100a8,0);
      sVar2 = std::array<unsigned_char,_65536UL>::size
                        ((array<unsigned_char,_65536UL> *)&stream.reserved);
      sVar3 = File::Read<unsigned_char>(fin,puVar1,sVar2);
      stream.next_in._0_4_ = (int)sVar3;
      if ((int)stream.next_in == 0) break;
    }
    stream.total_in =
         (mz_ulong)
         std::array<unsigned_char,_65536UL>::operator[]
                   ((array<unsigned_char,_65536UL> *)&stream.reserved,0);
    sVar2 = std::array<unsigned_char,_65536UL>::size
                      ((array<unsigned_char,_65536UL> *)&stream.reserved);
    stream.next_out._0_4_ = (uint)sVar2;
    iStack_100b8 = mz_inflate((mz_streamp)&data,2);
    uVar4 = (ulong)(uint)stream.next_out;
    sVar2 = std::array<unsigned_char,_65536UL>::size
                      ((array<unsigned_char,_65536UL> *)&stream.reserved);
    if (uVar4 == sVar2) {
      fout_local = (File *)0xffffffffffffffff;
      goto LAB_0021408d;
    }
    target = std::array<unsigned_char,_65536UL>::operator[]
                       ((array<unsigned_char,_65536UL> *)&stream.reserved,0);
    sVar2 = std::array<unsigned_char,_65536UL>::size
                      ((array<unsigned_char,_65536UL> *)&stream.reserved);
    File::Write<unsigned_char>(fout,target,sVar2 - (uint)stream.next_out);
    sVar2 = std::array<unsigned_char,_65536UL>::size
                      ((array<unsigned_char,_65536UL> *)&stream.reserved);
    buf._M_elems._65528_8_ = (sVar2 - (uint)stream.next_out) + buf._M_elems._65528_8_;
  }
  if (iStack_100b8 < 0) {
    this = (funzip_exception *)__cxa_allocate_exception(0x10);
    funzip_exception::funzip_exception(this,"Inflate failed");
    __cxa_throw(this,&funzip_exception::typeinfo,funzip_exception::~funzip_exception);
  }
  mz_inflate((mz_streamp)&data,4);
  mz_inflateEnd((mz_streamp)&data);
  fout_local = (File *)buf._M_elems._65528_8_;
LAB_0021408d:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&uStack_100a8);
  return (int64_t)fout_local;
}

Assistant:

static int64_t uncompress(File& fout, int64_t inSize, File& fin)
{
    int64_t total = 0;
    std::array<uint8_t, 65536> buf;

    mz_stream stream{};
    mz_inflateInit2(&stream, -MZ_DEFAULT_WINDOW_BITS);

    auto data = std::make_unique<uint8_t[]>(inSize > 0 ? inSize : buf.size());

    if (inSize > 0) {
        fin.Read(&data[0], inSize);
        stream.next_in = &data[0];
        stream.avail_in = inSize;
    }
    int rc = MZ_OK;
    while (rc == MZ_OK) {
        if (inSize == 0 && stream.avail_in == 0) {
            stream.next_in = &data[0];
            stream.avail_in = fin.Read(&data[0], buf.size());
            if (stream.avail_in == 0)
                break;
        }
        stream.next_out = &buf[0];
        stream.avail_out = buf.size();

        rc = mz_inflate(&stream, MZ_SYNC_FLUSH);
        // Did we unpack anything?
        if (stream.avail_out == buf.size())
            return -1;
        fout.Write(&buf[0], buf.size() - stream.avail_out);
        total += (buf.size() - stream.avail_out);
    }
    if (rc < 0)
        throw funzip_exception("Inflate failed");

    mz_inflate(&stream, MZ_FINISH);

    mz_inflateEnd(&stream);

    return total;
}